

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,kj *param_2,Which *param_3,
                         undefined8 param_4,String *param_5)

{
  Which *value;
  Array<char> local_40;
  Array<char> local_28;
  
  toCharSequence<capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which&>
            ((String *)&local_28,param_2,param_3);
  toCharSequence<capnproto_test::capnp::test::TestInterleavedGroups::Group1::Which&>
            ((String *)&local_40,param_2 + 2,value);
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_28,(String *)(param_2 + 8),(StringPtr *)&local_40,
             param_5);
  Array<char>::~Array(&local_40);
  Array<char>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}